

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atoi.h
# Opt level: O0

uint jsteemann::atoi_positive<unsigned_int>(char *p,char *e,int *errcode)

{
  char cVar1;
  bool local_38;
  bool local_36;
  uint local_34;
  char c;
  uint result;
  char cutlim;
  uint cutoff;
  int *errcode_local;
  char *e_local;
  char *p_local;
  
  if (p == e) {
    *errcode = -1;
    p_local._4_4_ = 0;
  }
  else {
    local_34 = 0;
    e_local = p;
    do {
      cVar1 = *e_local;
      if ((((cVar1 == '\0') || (cVar1 == ' ')) || (cVar1 == '\t')) ||
         (((cVar1 == '\n' || (cVar1 == '\r')) || ((cVar1 == '\v' || (cVar1 == '\f')))))) {
        *errcode = 0;
        return local_34;
      }
      local_36 = cVar1 < '0' || '9' < cVar1;
      if (local_36) {
        *errcode = -1;
        return local_34;
      }
      local_38 = true;
      if (local_34 < 0x1999999a) {
        local_38 = local_34 == 0x19999999 && '\x05' < (char)(cVar1 + -0x30);
      }
      if (local_38) {
        *errcode = -3;
        return local_34;
      }
      local_34 = (int)(char)(cVar1 + -0x30) + local_34 * 10;
      e_local = e_local + 1;
    } while (e_local < e);
    *errcode = 0;
    p_local._4_4_ = local_34;
  }
  return p_local._4_4_;
}

Assistant:

inline T atoi_positive(char const* p, char const* e, int& errcode) JSTEEMANN_NOEXCEPT {
  if (ATOI_UNLIKELY(p == e)) {
    errcode = -1;
    return T();
  }

  constexpr T cutoff = (std::numeric_limits<T>::max)() / 10;
  constexpr char cutlim = (std::numeric_limits<T>::max)() % 10;
  T result = 0;

  do {
    char c = *p;

    if ((c == '\0') || (c == ' ') || (c == '\t') || (c == '\n') || (c == '\r') || (c == '\v') || (c == '\f')) {
      errcode = 0;
      return result;
    }

    // we expect only '0' to '9'. everything else is unexpected
    if (ATOI_UNLIKELY(c < '0' || c > '9')) {
      errcode = -1;
      return result;
    }

    c -= '0';
    // we expect the bulk of values to not hit the bounds restrictions
    if (ATOI_UNLIKELY(result > cutoff || (result == cutoff && c > cutlim))) {
      errcode = -3;
      return result;
    }
    result *= 10;
    result += c;
  } while (++p < e);

  errcode = 0;
  return result;
}